

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall unitStrings_si_Test::TestBody(unitStrings_si_Test *this)

{
  bool bVar1;
  unit *puVar2;
  char *pcVar3;
  uint64_t in_RCX;
  string *psVar4;
  string *psVar5;
  AssertHelper local_218;
  Message local_210;
  unit local_208;
  string local_200;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_6;
  Message local_1c8;
  unit local_1c0;
  string local_1b8;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_5;
  Message local_180;
  unit local_178;
  string local_170;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_4;
  Message local_138;
  string local_130;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_3;
  unit GPa;
  Message local_f0;
  unit local_e8;
  string local_e0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  unit local_a0;
  string local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [3];
  string local_48;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  unit nF;
  unitStrings_si_Test *this_local;
  
  units::unit::unit((unit *)&gtest_ar.message_,1e-09,(unit *)&units::F);
  puVar2 = (unit *)units::getDefaultFlags();
  psVar4 = &local_48;
  units::to_string_abi_cxx11_(psVar4,(units *)&gtest_ar.message_,puVar2,in_RCX);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            ((EqHelper *)local_28,"to_string(nF)","\"nF\"",psVar4,(char (*) [3])0x27d8db);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    psVar4 = (string *)0x4b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_a0 = units::unit::operator/((unit *)&units::one,(unit *)&gtest_ar.message_);
  puVar2 = (unit *)units::getDefaultFlags();
  psVar5 = &local_98;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_a0,puVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_78,"to_string(one / nF)","\"1/nF\"",psVar5,(char (*) [5])"1/nF");
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    psVar5 = (string *)0x4c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_e8 = units::unit::operator/((unit *)&units::currency,(unit *)&gtest_ar.message_);
  puVar2 = (unit *)units::getDefaultFlags();
  psVar4 = &local_e0;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_e8,puVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_c0,"to_string(currency / nF)","\"$/nF\"",psVar4,(char (*) [5])"$/nF")
  ;
  std::__cxx11::string::~string((string *)&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    psVar4 = (string *)0x4e;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&GPa,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&GPa,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&GPa);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  units::unit::unit((unit *)&gtest_ar_3.message_,1000000000.0,(unit *)&units::Pa);
  puVar2 = (unit *)units::getDefaultFlags();
  psVar5 = &local_130;
  units::to_string_abi_cxx11_(psVar5,(units *)&gtest_ar_3.message_,puVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            ((EqHelper *)local_110,"to_string(GPa)","\"GPa\"",psVar5,(char (*) [4])0x27d912);
  std::__cxx11::string::~string((string *)&local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    psVar5 = (string *)0x51;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  local_178 = units::unit::operator/((unit *)&units::one,(unit *)&gtest_ar_3.message_);
  puVar2 = (unit *)units::getDefaultFlags();
  psVar4 = &local_170;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_178,puVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_150,"to_string(one / GPa)","\"1/GPa\"",psVar4,(char (*) [6])"1/GPa");
  std::__cxx11::string::~string((string *)&local_170);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    psVar4 = (string *)0x52;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x52,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  local_1c0 = units::unit::operator/((unit *)&gtest_ar_3.message_,(unit *)&units::km);
  puVar2 = (unit *)units::getDefaultFlags();
  psVar5 = &local_1b8;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_1c0,puVar2,(uint64_t)psVar4);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_198,"to_string(GPa / km)","\"MPa/m\"",psVar5,(char (*) [6])"MPa/m");
  std::__cxx11::string::~string((string *)&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    psVar5 = (string *)0x54;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x54,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  local_208 = units::unit::operator*((unit *)&units::ft,(unit *)&units::lb);
  puVar2 = (unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_200,(units *)&local_208,puVar2,(uint64_t)psVar5);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_1e0,"to_string(ft * lb)","\"ft*lb\"",&local_200,(char (*) [6])"ft*lb"
            );
  std::__cxx11::string::~string((string *)&local_200);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              (&local_218,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x57,pcVar3);
    testing::internal::AssertHelper::operator=(&local_218,&local_210);
    testing::internal::AssertHelper::~AssertHelper(&local_218);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  return;
}

Assistant:

TEST(unitStrings, si)
{
    auto nF = unit(1e-9, F);
    EXPECT_EQ(to_string(nF), "nF");
    EXPECT_EQ(to_string(one / nF), "1/nF");

    EXPECT_EQ(to_string(currency / nF), "$/nF");

    auto GPa = unit(1e9, Pa);
    EXPECT_EQ(to_string(GPa), "GPa");
    EXPECT_EQ(to_string(one / GPa), "1/GPa");
    // automatic reduction
    EXPECT_EQ(to_string(GPa / km), "MPa/m");

    // two non-si units
    EXPECT_EQ(to_string(ft * lb), "ft*lb");
}